

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O0

void GenCodeCmdModd(CodeGenRegVmContext *ctx,RegVmCmd cmd)

{
  CodeGenRegVmContext *ctx_local;
  RegVmCmd cmd_local;
  
  ctx->vmState->x64ModdWrap = fmod;
  ctx->vmState->x86ModdWrap = x86ModdWrap;
  ctx_local._2_1_ = cmd.rB;
  EMIT_OP_REG_RPTR(&ctx->ctx,o_movsd,rXMM0,sQWORD,rEBX,(uint)ctx_local._2_1_ << 3);
  ctx_local._3_1_ = cmd.rC;
  ctx_local._4_4_ = cmd.argument;
  GenCodeLoadDoubleFromPointer(ctx,rEAX,rXMM1,ctx_local._3_1_,ctx_local._4_4_);
  CodeGenGenericContext::KillEarlyUnreadRegVmRegisters
            (&ctx->ctx,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
  EMIT_REG_READ(&ctx->ctx,rXMM0);
  EMIT_REG_READ(&ctx->ctx,rXMM1);
  EMIT_OP_RPTR(&ctx->ctx,o_call,sQWORD,rR13,((int)ctx->vmState + 0x1a0) - (int)ctx->vmState);
  ctx_local._1_1_ = cmd.rA;
  EMIT_OP_RPTR_REG(&ctx->ctx,o_movsd,sQWORD,rEBX,(uint)ctx_local._1_1_ << 3,rXMM0);
  return;
}

Assistant:

void GenCodeCmdModd(CodeGenRegVmContext &ctx, RegVmCmd cmd)
{
	ctx.vmState->x64ModdWrap = fmod;
	ctx.vmState->x86ModdWrap = x86ModdWrap;

#if defined(_M_X64)
	EMIT_OP_REG_RPTR(ctx.ctx, o_movsd, rXmmArg1, sQWORD, rREG, cmd.rB * 8); // Load lhs

	GenCodeLoadDoubleFromPointer(ctx, rRAX, rXmmArg2, cmd.rC, cmd.argument); // Load rhs

	ctx.ctx.KillEarlyUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);

	EMIT_REG_READ(ctx.ctx, rXmmArg1);
	EMIT_REG_READ(ctx.ctx, rXmmArg2);
	EMIT_OP_RPTR(ctx.ctx, o_call, sQWORD, rR13, unsigned(uintptr_t(&ctx.vmState->x64ModdWrap) - uintptr_t(ctx.vmState)));

	EMIT_OP_RPTR_REG(ctx.ctx, o_movsd, sQWORD, rREG, cmd.rA * 8, rXMM0); // Store double to target
#else
	EMIT_OP_NUM(ctx.ctx, o_push, cmd.argument);
	EMIT_OP_NUM(ctx.ctx, o_push, (cmd.rA << 16) | (cmd.rB << 8) | cmd.rC);
	EMIT_OP_NUM(ctx.ctx, o_push, uintptr_t(ctx.vmState));
	EMIT_OP_ADDR(ctx.ctx, o_call, sDWORD, uintptr_t(&ctx.vmState->x86ModdWrap));
	EMIT_OP_REG_NUM(ctx.ctx, o_add, rESP, 12);
#endif
}